

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceResetExt(zes_device_handle_t hDevice,zes_reset_properties_t *pProperties)

{
  zes_pfnDeviceResetExt_t pfnResetExt;
  ze_result_t result;
  zes_reset_properties_t *pProperties_local;
  zes_device_handle_t hDevice_local;
  
  pfnResetExt._4_4_ = ZE_RESULT_SUCCESS;
  if (_DAT_0011cae0 != (code *)0x0) {
    pfnResetExt._4_4_ = (*_DAT_0011cae0)(hDevice,pProperties);
  }
  return pfnResetExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceResetExt(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle for the device
        zes_reset_properties_t* pProperties             ///< [in] Device reset properties to apply
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnResetExt = context.zesDdiTable.Device.pfnResetExt;
        if( nullptr != pfnResetExt )
        {
            result = pfnResetExt( hDevice, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }